

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::IntegerFunctionCase::IntegerFunctionCase
          (IntegerFunctionCase *this,Context *context,char *name,char *description,
          ShaderType shaderType)

{
  ContextType type;
  GLSLVersion GVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__IntegerFunctionCase_021597f0;
  this->m_shaderType = shaderType;
  (this->m_spec).version = GLSL_VERSION_300_ES;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).inputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_spec).outputs.
  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_spec).globalDeclarations._M_dataplus._M_p =
       (pointer)&(this->m_spec).globalDeclarations.field_2;
  (this->m_spec).globalDeclarations._M_string_length = 0;
  (this->m_spec).globalDeclarations.field_2._M_local_buf[0] = '\0';
  (this->m_spec).source._M_dataplus._M_p = (pointer)&(this->m_spec).source.field_2;
  (this->m_spec).source._M_string_length = 0;
  (this->m_spec).source.field_2._M_local_buf[0] = '\0';
  this->m_numValues = 100;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_failMsg);
  this->m_executor = (ShaderExecutor *)0x0;
  type.super_ApiType.m_bits = (ApiType)(*context->m_renderCtx->_vptr_RenderContext[2])();
  GVar1 = glu::getContextTypeGLSLVersion(type);
  (this->m_spec).version = GVar1;
  return;
}

Assistant:

IntegerFunctionCase::IntegerFunctionCase (Context& context, const char* name, const char* description, glu::ShaderType shaderType)
	: TestCase		(context, name, description)
	, m_shaderType	(shaderType)
	, m_numValues	(100)
	, m_executor	(DE_NULL)
{
	m_spec.version = glu::getContextTypeGLSLVersion(context.getRenderContext().getType());
}